

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O1

_Bool background_threads_disable_single(tsd_t *tsd,background_thread_info_t *info)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int8_t *piVar3;
  pthread_mutex_t *__mutex;
  int iVar4;
  _Bool _Var5;
  void *ret;
  void *pvStack_28;
  
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
       tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
  if ((tsd->state).repr == '\0') {
    duckdb_je_tsd_slow_update(tsd);
  }
  __mutex = (pthread_mutex_t *)((long)&(info->mtx).field_0 + 0x48);
  iVar4 = pthread_mutex_trylock(__mutex);
  if (iVar4 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&info->mtx);
    (info->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(info->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if (&((info->mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    (info->mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
    ppwVar2 = &(info->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  if (info->state == background_thread_started) {
    info->state = background_thread_stopped;
    pthread_cond_signal((pthread_cond_t *)&info->cond);
    (info->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
    iVar4 = pthread_join(info->thread,&pvStack_28);
    _Var5 = iVar4 != 0;
    if (!_Var5) {
      duckdb_je_n_background_threads = duckdb_je_n_background_threads - 1;
    }
    piVar3 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == '\0') {
      duckdb_je_tsd_slow_update(tsd);
    }
  }
  else {
    (info->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
    piVar3 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == '\0') {
      duckdb_je_tsd_slow_update(tsd);
    }
    _Var5 = false;
  }
  return _Var5;
}

Assistant:

static bool
background_threads_disable_single(tsd_t *tsd, background_thread_info_t *info) {
	if (info == &background_thread_info[0]) {
		malloc_mutex_assert_owner(tsd_tsdn(tsd),
		    &background_thread_lock);
	} else {
		malloc_mutex_assert_not_owner(tsd_tsdn(tsd),
		    &background_thread_lock);
	}

	pre_reentrancy(tsd, NULL);
	malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
	bool has_thread;
	assert(info->state != background_thread_paused);
	if (info->state == background_thread_started) {
		has_thread = true;
		info->state = background_thread_stopped;
		pthread_cond_signal(&info->cond);
	} else {
		has_thread = false;
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);

	if (!has_thread) {
		post_reentrancy(tsd);
		return false;
	}
	void *ret;
	if (pthread_join(info->thread, &ret)) {
		post_reentrancy(tsd);
		return true;
	}
	assert(ret == NULL);
	n_background_threads--;
	post_reentrancy(tsd);

	return false;
}